

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

ON_Material *
ON_Material::FromModelComponentRef
          (ON_ModelComponentReference *model_component_reference,ON_Material *none_return_value)

{
  bool bVar1;
  ON_Material *this;
  ON_Material *pOVar2;
  
  this = (ON_Material *)ON_ModelComponentReference::ModelComponent(model_component_reference);
  if (this == (ON_Material *)0x0) {
    pOVar2 = (ON_Material *)0x0;
  }
  else {
    bVar1 = ON_Object::IsKindOf((ON_Object *)this,&m_ON_Material_class_rtti);
    pOVar2 = (ON_Material *)0x0;
    if (bVar1) {
      pOVar2 = this;
    }
  }
  if (pOVar2 != (ON_Material *)0x0) {
    none_return_value = pOVar2;
  }
  return none_return_value;
}

Assistant:

const ON_Material* ON_Material::FromModelComponentRef(
  const class ON_ModelComponentReference& model_component_reference,
  const ON_Material* none_return_value
  )
{
  const ON_Material* p = ON_Material::Cast(model_component_reference.ModelComponent());
  return (nullptr != p) ? p : none_return_value;
}